

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O0

void printFuncHeaderDoc(FILE *out,TA_FuncInfo *funcInfo,char *prefix)

{
  double dVar1;
  TA_InputParameterType TVar2;
  char *pcVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  FILE *in_RDI;
  bool bVar4;
  int first;
  TA_OutputParameterInfo *outputParamInfo;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_InputParameterInfo *inputParamInfo;
  char *defaultParamName;
  char *paramName;
  uint paramNb;
  TA_RetCode retCode;
  TA_OutputParameterInfo *local_48;
  TA_OptInputParameterInfo *local_40;
  TA_InputParameterInfo *local_38;
  char *local_30;
  char *local_28;
  uint local_20;
  TA_RetCode local_1c;
  undefined8 local_18;
  undefined8 *local_10;
  FILE *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fprintf(in_RDI,"%sTA_%s - %s\n",in_RDX,*in_RSI,in_RSI[2]);
  fprintf(local_8,"%s\n",local_18);
  fprintf(local_8,"%sInput  = ",local_18);
  for (local_20 = 0; local_20 < *(uint *)((long)local_10 + 0x24); local_20 = local_20 + 1) {
    local_1c = TA_GetInputParameterInfo((TA_FuncHandle *)local_10[6],local_20,&local_38);
    if (local_1c != TA_SUCCESS) {
      printf("[%s] invalid \'input\' information\n",*local_10);
      return;
    }
    TVar2 = local_38->type;
    if (TVar2 == TA_Input_Price) {
      bVar4 = (local_38->flags & 1U) != 0;
      if (bVar4) {
        fprintf(local_8,"Open");
      }
      bVar4 = !bVar4;
      if ((local_38->flags & 2U) != 0) {
        if (!bVar4) {
          fprintf(local_8,", ");
        }
        fprintf(local_8,"High");
        bVar4 = false;
      }
      if ((local_38->flags & 4U) != 0) {
        if (!bVar4) {
          fprintf(local_8,", ");
        }
        fprintf(local_8,"Low");
        bVar4 = false;
      }
      if ((local_38->flags & 8U) != 0) {
        if (!bVar4) {
          fprintf(local_8,", ");
        }
        fprintf(local_8,"Close");
        bVar4 = false;
      }
      if ((local_38->flags & 0x10U) != 0) {
        if (!bVar4) {
          fprintf(local_8,", ");
        }
        fprintf(local_8,"Volume");
        bVar4 = false;
      }
      if ((local_38->flags & 0x20U) != 0) {
        if (!bVar4) {
          fprintf(local_8,", ");
        }
        fprintf(local_8,"OpenInterest");
        bVar4 = false;
      }
      if ((local_38->flags & 0x40U) != 0) {
        if (!bVar4) {
          fprintf(local_8,", ");
        }
        fprintf(local_8,"Timestamp");
      }
    }
    else if (TVar2 == TA_Input_Real) {
      fprintf(local_8,"double");
    }
    else if (TVar2 == TA_Input_Integer) {
      fprintf(local_8,"int");
    }
    if (local_20 + 1 == *(int *)((long)local_10 + 0x24)) {
      fprintf(local_8,"\n");
    }
    else {
      fprintf(local_8,", ");
    }
  }
  fprintf(local_8,"%sOutput = ",local_18);
  for (local_20 = 0; local_20 < *(uint *)((long)local_10 + 0x2c); local_20 = local_20 + 1) {
    local_1c = TA_GetOutputParameterInfo((TA_FuncHandle *)local_10[6],local_20,&local_48);
    if (local_1c != TA_SUCCESS) {
      printf("[%s] invalid \'output\' information\n",*local_10);
      return;
    }
    if (local_48->type == TA_Output_Real) {
      fprintf(local_8,"double");
    }
    else if (local_48->type == TA_Output_Integer) {
      fprintf(local_8,"int");
    }
    if (local_20 + 1 == *(int *)((long)local_10 + 0x2c)) {
      fprintf(local_8,"\n");
    }
    else {
      fprintf(local_8,", ");
    }
  }
  if (*(int *)(local_10 + 5) != 0) {
    fprintf(local_8,"%s\n",local_18);
    fprintf(local_8,"%sOptional Parameters\n",local_18);
    fprintf(local_8,"%s-------------------\n",local_18);
    for (local_20 = 0; local_20 < *(uint *)(local_10 + 5); local_20 = local_20 + 1) {
      local_1c = TA_GetOptInputParameterInfo((TA_FuncHandle *)local_10[6],local_20,&local_40);
      if (local_1c != TA_SUCCESS) {
        printf("[%s] invalid \'optional input\' information\n",*local_10);
        return;
      }
      local_28 = local_40->paramName;
      if (local_40->type < TA_OptInput_IntegerRange) {
        local_30 = "optInReal";
      }
      else {
        if (1 < local_40->type - TA_OptInput_IntegerRange) {
          if (local_28 == (char *)0x0) {
            local_28 = "optInParam";
          }
          printf("[%s,%s,%d] invalid \'optional input\' type(%d)\n",*local_10,local_28,
                 (ulong)local_20,(ulong)local_40->type);
          return;
        }
        local_30 = "optInInteger";
      }
      if (local_28 == (char *)0x0) {
        local_28 = local_30;
      }
      fprintf(local_8,"%s%s:",local_18,local_28);
      if (local_40->type == TA_OptInput_RealRange) {
        if ((*local_40->dataSet != -3e+37) || (NAN(*local_40->dataSet))) {
          fprintf(local_8,"(From %.*g",*local_40->dataSet,
                  (ulong)*(uint *)((long)local_40->dataSet + 0x10));
        }
        else {
          fprintf(local_8,"(From TA_REAL_MIN");
        }
        dVar1 = *(double *)((long)local_40->dataSet + 8);
        if ((dVar1 != 3e+37) || (NAN(dVar1))) {
          pcVar3 = "";
          if ((local_40->flags & 0x100000U) != 0) {
            pcVar3 = " %";
          }
          fprintf(local_8," to %.*g%s)\n",*(undefined8 *)((long)local_40->dataSet + 8),
                  (ulong)*(uint *)((long)local_40->dataSet + 0x10),pcVar3);
        }
        else {
          fprintf(local_8," to TA_REAL_MAX)\n");
        }
      }
      else if (local_40->type == TA_OptInput_IntegerRange) {
        if (*local_40->dataSet == -0x7fffffff) {
          fprintf(local_8,"(From TA_INTEGER_MIN");
        }
        else {
          fprintf(local_8,"(From %d",(ulong)*local_40->dataSet);
        }
        if (*(int *)((long)local_40->dataSet + 4) == 0x7fffffff) {
          fprintf(local_8," to TA_INTEGER_MAX)\n");
        }
        else {
          fprintf(local_8," to %d)\n",(ulong)*(uint *)((long)local_40->dataSet + 4));
        }
      }
      else {
        fprintf(local_8,"\n");
      }
      fprintf(local_8,"%s   %s\n",local_18,local_40->hint);
      fprintf(local_8,"%s\n",local_18);
    }
  }
  fprintf(local_8,"%s\n",local_18);
  return;
}

Assistant:

static void printFuncHeaderDoc( FILE *out,
                                const TA_FuncInfo *funcInfo,
                                const char *prefix )
{
   TA_RetCode retCode;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   const TA_InputParameterInfo *inputParamInfo;
   const TA_OptInputParameterInfo *optInputParamInfo;
   const TA_OutputParameterInfo *outputParamInfo;
   int first;

   fprintf( out, "%sTA_%s - %s\n", prefix, funcInfo->name, funcInfo->hint );
   fprintf( out, "%s\n", prefix );


   fprintf( out, "%sInput  = ", prefix );
   for( paramNb=0; paramNb < funcInfo->nbInput; paramNb++ )
   {
      retCode = TA_GetInputParameterInfo( funcInfo->handle,
                                          paramNb, &inputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'input' information\n", funcInfo->name );
         return;
      }

      switch( inputParamInfo->type )
      {
      case TA_Input_Price:
         first = 1;
         #define PRICE_PARAM(upperParam,lowerParam) \
         { \
            if( inputParamInfo->flags & TA_IN_PRICE_##upperParam ) \
            { \
               if( !first ) fprintf( out, ", " ); \
               fprintf( out, lowerParam ); \
               first = 0; \
            } \
         }

         PRICE_PARAM( OPEN,         "Open" );
         PRICE_PARAM( HIGH,         "High" );
         PRICE_PARAM( LOW,          "Low" );
         PRICE_PARAM( CLOSE,        "Close" );
         PRICE_PARAM( VOLUME,       "Volume" );
         PRICE_PARAM( OPENINTEREST, "OpenInterest" );
         PRICE_PARAM( TIMESTAMP,    "Timestamp" );

         #undef PRICE_PARAM

         break;
      case TA_Input_Integer:
         fprintf( out, "int" );
         break;
      case TA_Input_Real:
         fprintf( out, "double" );
         break;
      }
      if( paramNb+1 == funcInfo->nbInput )
         fprintf( out, "\n" );
      else
         fprintf( out, ", " );
   }

   fprintf( out, "%sOutput = ", prefix );
   for( paramNb=0; paramNb < funcInfo->nbOutput; paramNb++ )
   {
      retCode = TA_GetOutputParameterInfo( funcInfo->handle,
                                           paramNb, &outputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'output' information\n", funcInfo->name );
         return;
      }

      switch( outputParamInfo->type )
      {
      case TA_Output_Real:
         fprintf( out, "double" );
         break;
      case TA_Output_Integer:
         fprintf( out, "int" );
         break;
      }
      if( paramNb+1 == funcInfo->nbOutput )
         fprintf( out, "\n" );
      else
         fprintf( out, ", " );
   }

   if( funcInfo->nbOptInput != 0 )
   {
      fprintf( out, "%s\n", prefix );
      fprintf( out, "%sOptional Parameters\n", prefix );
      fprintf( out, "%s-------------------\n", prefix );

      for( paramNb=0; paramNb < funcInfo->nbOptInput; paramNb++ )
      {
         retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                                paramNb, &optInputParamInfo );

         if( retCode != TA_SUCCESS )
         {
            printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
            return;
         }

         paramName = optInputParamInfo->paramName;

         switch( optInputParamInfo->type )
         {
         case TA_OptInput_RealRange:
         case TA_OptInput_RealList:
            defaultParamName = "optInReal";
            break;
         case TA_OptInput_IntegerRange:
         case TA_OptInput_IntegerList:
            defaultParamName = "optInInteger";
            break;
         default:
            if( !paramName )
               paramName = "optInParam";
            printf( "[%s,%s,%d] invalid 'optional input' type(%d)\n",
                    funcInfo->name, paramName, paramNb,
                    optInputParamInfo->type );
            return;
         }

         if( !paramName )
            paramName = defaultParamName;

         fprintf( out, "%s%s:", prefix, paramName );
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_RealRange:
               if( ((TA_RealRange *)(optInputParamInfo->dataSet))->min == TA_REAL_MIN )
                  fprintf( out, "(From TA_REAL_MIN" );
               else
               {
                  fprintf( out, "(From %.*g",
                           ((TA_RealRange *)(optInputParamInfo->dataSet))->precision,
                           ((TA_RealRange *)(optInputParamInfo->dataSet))->min );
               }

               if( ((TA_RealRange *)(optInputParamInfo->dataSet))->max == TA_REAL_MAX )
                  fprintf( out, " to TA_REAL_MAX)\n" );
               else
               {
                  fprintf( out, " to %.*g%s)\n",
                          ((TA_RealRange *)(optInputParamInfo->dataSet))->precision,
                          ((TA_RealRange *)(optInputParamInfo->dataSet))->max,
                          optInputParamInfo->flags & TA_OPTIN_IS_PERCENT? " %":"" );
               }
               break;
         case TA_OptInput_IntegerRange:
               if( ((TA_IntegerRange *)(optInputParamInfo->dataSet))->min == TA_INTEGER_MIN )
                  fprintf( out, "(From TA_INTEGER_MIN" );
               else
               {
                  fprintf( out, "(From %d",
                           ((TA_IntegerRange *)(optInputParamInfo->dataSet))->min );
               }

               if( ((TA_IntegerRange *)(optInputParamInfo->dataSet))->max == TA_INTEGER_MAX )
                  fprintf( out, " to TA_INTEGER_MAX)\n" );
               else
               {
                  fprintf( out, " to %d)\n",
                          ((TA_IntegerRange *)(optInputParamInfo->dataSet))->max );
               }
               break;
         default:
             fprintf( out, "\n" );
         }
         fprintf( out, "%s   %s\n", prefix, optInputParamInfo->hint );
         fprintf( out, "%s\n", prefix );
      }
   }

   fprintf( out, "%s\n", prefix );
}